

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

Decoration
anon_unknown.dwarf_889438::TranslateLayoutDecoration(TType *type,TLayoutMatrix matrixLayout)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  TLayoutMatrix matrixLayout_local;
  TType *type_local;
  
  uVar3 = (*type->_vptr_TType[0x1c])();
  if ((uVar3 & 1) == 0) {
    iVar4 = (*type->_vptr_TType[7])();
    if (iVar4 == 0x10) {
      iVar4 = (*type->_vptr_TType[0xb])();
      uVar3 = *(uint *)(CONCAT44(extraout_var,iVar4) + 8) & 0x7f;
      if (uVar3 - 3 < 2) {
        iVar4 = (*type->_vptr_TType[0xb])();
        bVar2 = glslang::TQualifier::isTaskMemory((TQualifier *)CONCAT44(extraout_var_01,iVar4));
        if (bVar2) {
          iVar4 = (*type->_vptr_TType[0xb])();
          bVar1 = *(byte *)(CONCAT44(extraout_var_02,iVar4) + 0x10) & 0xf;
          if (bVar1 == 1) {
            return DecorationGLSLShared;
          }
          if (bVar1 == 4) {
            return DecorationGLSLPacked;
          }
        }
        else {
          iVar4 = (*type->_vptr_TType[0xb])();
          if ((*(byte *)(CONCAT44(extraout_var_03,iVar4) + 0x10) & 0xf) != 0) {
            __assert_fail("type.getQualifier().layoutPacking == glslang::ElpNone",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                          ,0x1c9,
                          "spv::Decoration (anonymous namespace)::TranslateLayoutDecoration(const glslang::TType &, glslang::TLayoutMatrix)"
                         );
          }
        }
        type_local._4_4_ = DecorationMax;
      }
      else if (uVar3 - 5 < 3) {
        iVar4 = (*type->_vptr_TType[0xb])();
        bVar1 = *(byte *)(CONCAT44(extraout_var_00,iVar4) + 0x10) & 0xf;
        if (bVar1 == 1) {
          type_local._4_4_ = DecorationGLSLShared;
        }
        else if (bVar1 == 4) {
          type_local._4_4_ = DecorationGLSLPacked;
        }
        else {
          type_local._4_4_ = DecorationMax;
        }
      }
      else {
        if (5 < uVar3 - 9) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                        ,0x1d4,
                        "spv::Decoration (anonymous namespace)::TranslateLayoutDecoration(const glslang::TType &, glslang::TLayoutMatrix)"
                       );
        }
        type_local._4_4_ = DecorationMax;
      }
    }
    else {
      type_local._4_4_ = DecorationMax;
    }
  }
  else if (matrixLayout == ElmRowMajor) {
    type_local._4_4_ = DecorationRowMajor;
  }
  else if (matrixLayout == ElmColumnMajor) {
    type_local._4_4_ = ColMajor;
  }
  else {
    type_local._4_4_ = DecorationMax;
  }
  return type_local._4_4_;
}

Assistant:

spv::Decoration TranslateLayoutDecoration(const glslang::TType& type, glslang::TLayoutMatrix matrixLayout)
{
    if (type.isMatrix()) {
        switch (matrixLayout) {
        case glslang::ElmRowMajor:
            return spv::DecorationRowMajor;
        case glslang::ElmColumnMajor:
            return spv::DecorationColMajor;
        default:
            // opaque layouts don't need a majorness
            return spv::DecorationMax;
        }
    } else {
        switch (type.getBasicType()) {
        default:
            return spv::DecorationMax;
            break;
        case glslang::EbtBlock:
            switch (type.getQualifier().storage) {
            case glslang::EvqShared:
            case glslang::EvqUniform:
            case glslang::EvqBuffer:
                switch (type.getQualifier().layoutPacking) {
                case glslang::ElpShared:  return spv::DecorationGLSLShared;
                case glslang::ElpPacked:  return spv::DecorationGLSLPacked;
                default:
                    return spv::DecorationMax;
                }
            case glslang::EvqVaryingIn:
            case glslang::EvqVaryingOut:
                if (type.getQualifier().isTaskMemory()) {
                    switch (type.getQualifier().layoutPacking) {
                    case glslang::ElpShared:  return spv::DecorationGLSLShared;
                    case glslang::ElpPacked:  return spv::DecorationGLSLPacked;
                    default: break;
                    }
                } else {
                    assert(type.getQualifier().layoutPacking == glslang::ElpNone);
                }
                return spv::DecorationMax;
            case glslang::EvqPayload:
            case glslang::EvqPayloadIn:
            case glslang::EvqHitAttr:
            case glslang::EvqCallableData:
            case glslang::EvqCallableDataIn:
            case glslang::EvqHitObjectAttrNV:
                return spv::DecorationMax;
            default:
                assert(0);
                return spv::DecorationMax;
            }
        }
    }
}